

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.hpp
# Opt level: O0

void __thiscall WorkSpace::~WorkSpace(WorkSpace *this)

{
  SequenceDistanceGraph *in_RDI;
  vector<DistanceGraph,_std::allocator<DistanceGraph>_> *unaff_retaddr;
  
  std::vector<JournalOperation,_std::allocator<JournalOperation>_>::~vector
            ((vector<JournalOperation,_std::allocator<JournalOperation>_> *)unaff_retaddr);
  std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>::~vector(unaff_retaddr);
  std::vector<KmerCounter,_std::allocator<KmerCounter>_>::~vector
            ((vector<KmerCounter,_std::allocator<KmerCounter>_> *)unaff_retaddr);
  std::vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>::~vector
            ((vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_> *)unaff_retaddr);
  std::vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>::~vector
            ((vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_> *)unaff_retaddr);
  std::vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>::~vector
            ((vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_> *)unaff_retaddr);
  SequenceDistanceGraph::~SequenceDistanceGraph(in_RDI);
  return;
}

Assistant:

WorkSpace(const WorkSpace& that) = delete;